

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void install_phaser_inter(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_Constraint *pAVar5;
  ulong uVar6;
  Am_Object AVar7;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,true,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Federation_Phaser_Style);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  Am_Object::operator=(&SP_Federation_Phaser_Beam,pAVar4);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,true,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Klingon_Phaser_Style);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  Am_Object::operator=(&SP_Klingon_Phaser_Beam,pAVar4);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Create((char *)&local_18);
  uVar2 = Am_Object::Set((ushort)&local_18,(char *)0xb9,0x10a2d7);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xba,_Am_Inter_In_Part);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)pick_phaser_beam);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0xdc,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,true,1);
  uVar6 = Am_Object::Set(uVar2,0xde,0);
  Am_Object::Get_Object((ushort)&local_30,uVar6);
  uVar2 = Am_Object::Set((ushort)&local_30,(Am_Method_Wrapper *)0xca,
                         (ulong)destroy_ship.from_wrapper);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x146,(ulong)hide_ship_command.from_wrapper);
  uVar6 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x147,(ulong)hide_ship_command.from_wrapper);
  Am_Object::Get_Object((ushort)&local_40,uVar6);
  Am_Object::operator=(&SP_Phaser_Inter,&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&SP_Federation_Phaser_Beam);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10e3d0,SUB81(&local_20,0),1);
  Am_Object::Am_Object(&local_38,&SP_Klingon_Phaser_Beam);
  Am_Object::Add_Part(AVar7,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_20);
  AVar1 = PHASER_INTER;
  Am_Object::Am_Object(&local_28,&SP_Phaser_Inter);
  AVar7.data._2_6_ = 0;
  AVar7.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xe3f0,AVar7,(ulong)&local_28);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
install_phaser_inter()
{
  // Add the phaser beams to the SP_Clip_Win so that it is not iterated
  // over by do_springy when the tractor beam endpoints are adjusted, and
  //
  SP_Federation_Phaser_Beam =
      Am_Line.Create("SP_Phaser_Beam")
          .Set(Am_VISIBLE, false) // Set by interactor
          .Set(Am_LINE_STYLE, SP_Federation_Phaser_Style);
  SP_Klingon_Phaser_Beam = Am_Line.Create("SP_Phaser_Beam")
                               .Set(Am_VISIBLE, false) // Set by interactor
                               .Set(Am_LINE_STYLE, SP_Klingon_Phaser_Style);
  SP_Phaser_Inter = Am_New_Points_Interactor
                        .Create("SP_Phaser_Inter")
#if defined(_WINDOWS)
                        .Set(Am_START_WHEN, "META_LEFT_DOWN")
#else
                        .Set(Am_START_WHEN, "MIDDLE_DOWN")
#endif
                        .Set(Am_START_WHERE_TEST, Am_Inter_In_Part)
                        .Set(Am_FEEDBACK_OBJECT, (pick_phaser_beam))

                        .Set(Am_AS_LINE, true)
                        .Set(Am_CREATE_NEW_OBJECT_METHOD,
                             0L) //not really creating something
                        .Get_Object(Am_COMMAND)
                        .Set(Am_DO_METHOD, destroy_ship)
                        .Set(Am_UNDO_METHOD, hide_ship_command)
                        .Set(Am_REDO_METHOD, hide_ship_command)
                        .Get_Owner(); // Return inter to bind SP_Phaser_Inter

  SP_Clip_Win.Add_Part(SP_Federation_Phaser_Beam)
      .Add_Part(SP_Klingon_Phaser_Beam);
  SP_Ship_Agg.Add_Part(PHASER_INTER, SP_Phaser_Inter);
}